

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

int svd_gr(double *A,int M,int N,double *U,double *V,double *q)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  void *__ptr;
  double dVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_d0;
  double local_c8;
  double *e;
  double z;
  double y;
  double c;
  double scale;
  double h;
  double f;
  double temp;
  double s;
  double x;
  double g;
  double eps;
  int l1;
  int iter;
  int cancel;
  int ierr;
  int t2;
  int t;
  int l;
  int k;
  int j;
  int i;
  double *q_local;
  double *V_local;
  double *U_local;
  int N_local;
  int M_local;
  double *A_local;
  
  __ptr = malloc((long)N << 3);
  dVar7 = macheps();
  s = 0.0;
  c = 0.0;
  x = 0.0;
  for (k = 0; k < M * N; k = k + 1) {
    U[k] = A[k];
  }
  for (k = 0; k < N; k = k + 1) {
    t2 = k + 1;
    *(double *)((long)__ptr + (long)k * 8) = c * x;
    x = 0.0;
    temp = 0.0;
    c = 0.0;
    if (k < M) {
      for (t = k; t < M; t = t + 1) {
        c = ABS(U[t * N + k]) + c;
      }
      if ((c != 0.0) || (NAN(c))) {
        for (t = k; t < M; t = t + 1) {
          iVar3 = t * N + k;
          U[iVar3] = U[iVar3] / c;
          temp = U[t * N + k] * U[t * N + k] + temp;
        }
        dVar8 = U[k * N + k];
        if (0.0 <= dVar8) {
          local_c8 = sqrt(temp);
          local_c8 = -local_c8;
        }
        else {
          local_c8 = sqrt(temp);
        }
        x = local_c8;
        dVar4 = -temp;
        U[k * N + k] = dVar8 - local_c8;
        l = t2;
        if (k < N + -1) {
          for (; l < N; l = l + 1) {
            temp = 0.0;
            for (t = k; t < M; t = t + 1) {
              temp = U[t * N + k] * U[t * N + l] + temp;
            }
            for (t = k; t < M; t = t + 1) {
              iVar3 = t * N + l;
              U[iVar3] = (temp / (dVar8 * local_c8 + dVar4)) * U[t * N + k] + U[iVar3];
            }
          }
        }
        for (t = k; t < M; t = t + 1) {
          iVar3 = t * N + k;
          U[iVar3] = c * U[iVar3];
        }
      }
    }
    q[k] = c * x;
    x = 0.0;
    temp = 0.0;
    c = 0.0;
    if ((k < M) && (k != N + -1)) {
      iVar3 = k * N;
      for (t = t2; t < M; t = t + 1) {
        c = ABS(U[iVar3 + t]) + c;
      }
      t = t2;
      if ((c != 0.0) || (NAN(c))) {
        for (; t < N; t = t + 1) {
          U[iVar3 + t] = U[iVar3 + t] / c;
          temp = U[iVar3 + t] * U[iVar3 + t] + temp;
        }
        dVar8 = U[iVar3 + t2];
        if (0.0 <= dVar8) {
          local_d0 = sqrt(temp);
          local_d0 = -local_d0;
        }
        else {
          local_d0 = sqrt(temp);
        }
        x = local_d0;
        U[iVar3 + t2] = dVar8 - local_d0;
        for (t = t2; l = t2, t < N; t = t + 1) {
          *(double *)((long)__ptr + (long)t * 8) = U[iVar3 + t] / (dVar8 * local_d0 + -temp);
        }
        for (; t = t2, l < M; l = l + 1) {
          temp = 0.0;
          for (; iVar5 = t2, t < N; t = t + 1) {
            temp = U[l * N + t] * U[iVar3 + t] + temp;
          }
          while (t = iVar5, t < N) {
            iVar5 = l * N + t;
            U[iVar5] = temp * *(double *)((long)__ptr + (long)t * 8) + U[iVar5];
            iVar5 = t + 1;
          }
        }
        for (; t < N; t = t + 1) {
          U[iVar3 + t] = c * U[iVar3 + t];
        }
      }
    }
    dVar8 = ABS(q[k]) + ABS(*(double *)((long)__ptr + (long)k * 8));
    if (s < dVar8) {
      s = dVar8;
    }
  }
  for (k = N + -1; -1 < k; k = k + -1) {
    iVar3 = k * N;
    if (k < N + -1) {
      if ((x != 0.0) || (NAN(x))) {
        dVar8 = U[iVar3 + k + 1];
        for (l = t2; l < N; l = l + 1) {
          V[l * N + k] = U[iVar3 + l] / (dVar8 * x);
        }
        for (l = t2; l < N; l = l + 1) {
          temp = 0.0;
          for (t = t2; t < N; t = t + 1) {
            temp = U[iVar3 + t] * V[t * N + l] + temp;
          }
          for (t = t2; t < N; t = t + 1) {
            iVar5 = t * N + l;
            V[iVar5] = temp * V[t * N + k] + V[iVar5];
          }
        }
      }
      for (l = t2; l < N; l = l + 1) {
        V[l * N + k] = 0.0;
        V[iVar3 + l] = 0.0;
      }
    }
    V[iVar3 + k] = 1.0;
    x = *(double *)((long)__ptr + (long)k * 8);
    t2 = k;
  }
  for (k = N + -1; -1 < k; k = k + -1) {
    iVar3 = k * N;
    iVar5 = k + 1;
    dVar8 = q[k];
    l = iVar5;
    if (k < N + -1) {
      for (; l < N; l = l + 1) {
        U[iVar3 + l] = 0.0;
      }
    }
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      l = iVar5;
      if (k != N + -1) {
        for (; l < N; l = l + 1) {
          temp = 0.0;
          for (t = iVar5; t < M; t = t + 1) {
            temp = U[t * N + k] * U[t * N + l] + temp;
          }
          dVar4 = U[iVar3 + k];
          for (t = k; t < M; t = t + 1) {
            iVar6 = t * N + l;
            U[iVar6] = ((temp / dVar4) / dVar8) * U[t * N + k] + U[iVar6];
          }
        }
      }
      for (l = k; l < M; l = l + 1) {
        U[l * N + k] = U[l * N + k] / dVar8;
      }
    }
    else {
      for (l = k; l < M; l = l + 1) {
        U[l * N + k] = 0.0;
      }
    }
    U[iVar3 + k] = U[iVar3 + k] + 1.0;
  }
  dVar7 = dVar7 * s;
  t = N + -1;
LAB_00157d1e:
  if (t < 0) {
    svd_sort(U,M,N,V,q);
    free(__ptr);
    return 0;
  }
  eps._4_4_ = 0;
  do {
    eps._4_4_ = eps._4_4_ + 1;
    if (0x32 < eps._4_4_) {
      printf("Convergence Not Achieved \n");
      return 0xf;
    }
    bVar2 = true;
    for (t2 = t; -1 < t2; t2 = t2 + -1) {
      if (ABS(*(double *)((long)__ptr + (long)t2 * 8)) <= dVar7) {
        bVar2 = false;
        break;
      }
      if (ABS(q[t2 + -1]) <= dVar7) break;
    }
    if (bVar2) {
      y = 0.0;
      temp = 1.0;
      for (k = t2; k <= t; k = k + 1) {
        dVar8 = temp * *(double *)((long)__ptr + (long)k * 8);
        *(double *)((long)__ptr + (long)k * 8) = y * *(double *)((long)__ptr + (long)k * 8);
        if (ABS(dVar8) <= dVar7) break;
        dVar4 = q[k];
        dVar9 = hypot(dVar8,dVar4);
        q[k] = dVar9;
        y = dVar4 / dVar9;
        temp = -dVar8 / dVar9;
        for (l = 0; l < M; l = l + 1) {
          iVar3 = l * N;
          dVar8 = U[iVar3 + t2 + -1];
          dVar4 = U[iVar3 + k];
          U[iVar3 + t2 + -1] = dVar8 * y + dVar4 * temp;
          U[iVar3 + k] = dVar4 * y + -(dVar8 * temp);
        }
      }
    }
    dVar8 = q[t];
    if (t2 == t) break;
    s = q[t2];
    dVar4 = q[t + -1];
    dVar9 = *(double *)((long)__ptr + (long)(t + -1) * 8);
    dVar11 = *(double *)((long)__ptr + (long)t * 8);
    dVar9 = ((((dVar9 + dVar8) / dVar11) * ((dVar9 - dVar8) / dVar4) + dVar4 / dVar11) -
            dVar11 / dVar4) * 0.5;
    dVar10 = hypot(dVar9,1.0);
    if (0.0 <= dVar9) {
      f = dVar9 + dVar10;
    }
    else {
      f = dVar9 - dVar10;
    }
    h = (dVar11 / s) * (dVar4 / f - dVar11) + -(dVar8 / s) * dVar8 + s;
    temp = 1.0;
    y = 1.0;
    iVar3 = t2;
    while (k = iVar3 + 1, k <= t) {
      dVar8 = *(double *)((long)__ptr + (long)k * 8);
      dVar4 = q[k];
      dVar9 = temp * dVar8;
      dVar8 = y * dVar8;
      dVar11 = hypot(h,dVar9);
      *(double *)((long)__ptr + (long)iVar3 * 8) = dVar11;
      y = h / dVar11;
      temp = dVar9 / dVar11;
      dVar9 = s * y + dVar8 * temp;
      dVar8 = dVar8 * y + -(s * temp);
      dVar11 = dVar4 * temp;
      dVar4 = y * dVar4;
      for (l = 0; l < N; l = l + 1) {
        iVar5 = l * N;
        dVar10 = V[iVar5 + k + -1];
        dVar1 = V[iVar5 + k];
        V[iVar5 + k + -1] = dVar10 * y + dVar1 * temp;
        V[iVar5 + k] = dVar1 * y + -(dVar10 * temp);
      }
      dVar10 = hypot(dVar9,dVar11);
      q[iVar3] = dVar10;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        y = dVar9 / dVar10;
        temp = dVar11 / dVar10;
      }
      h = y * dVar8 + temp * dVar4;
      s = y * dVar4 + -(temp * dVar8);
      for (l = 0; iVar3 = k, l < M; l = l + 1) {
        iVar3 = l * N;
        dVar8 = U[iVar3 + k + -1];
        dVar4 = U[iVar3 + k];
        U[iVar3 + k + -1] = dVar8 * y + dVar4 * temp;
        U[iVar3 + k] = dVar4 * y + -(dVar8 * temp);
      }
    }
    *(undefined8 *)((long)__ptr + (long)t2 * 8) = 0;
    *(double *)((long)__ptr + (long)t * 8) = h;
    q[t] = s;
  } while( true );
  if (dVar8 < 0.0) {
    q[t] = -dVar8;
    for (l = 0; l < N; l = l + 1) {
      V[l * N + t] = -V[l * N + t];
    }
  }
  t = t + -1;
  goto LAB_00157d1e;
}

Assistant:

int svd_gr(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,scale,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */

	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	g = scale = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = scale * g;
		g = 0.0;
		s = 0.0;
		scale = 0.0;

		if (i < M) {
			for(k = i; k < M;++k) {
				scale += fabs(U[k*N+i]);
			}

			if (scale != 0.0) {
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] /= scale;
					temp = U[t+i];
					s += temp*temp;
				}
				f = U[i*N+i];
				g = (f < 0) ? sqrt(s) : -sqrt(s);
				h = f * g - s;
				U[i*N+i] = f - g;

				if (i < N - 1) {
					for(j = l; j < N;++j) {
						s = 0.0;
						for(k = i; k < M;++k) {
							t = k * N;
							s += U[t+i]*U[t+j];
						}
						f = s / h;
						for(k = i; k < M;++k) {
							t = k * N;
							U[t+j] += f * U[t+i];
						}
					}
				}
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] *= scale;
				}
			}
		}
        q[i] = scale * g;
        g = 0.0;
        s = 0.0;
        scale = 0.0;

        if (i < M && i != N - 1) {
        	t = i *N;
        	for(k = l; k < M;++k) {
        		scale += fabs(U[t+k]);
        	}
        	if (scale != 0.0) {
        		for(k = l; k < N;++k) {
        			U[t+k] /= scale;
        			temp = U[t+k];
        			s = s + temp*temp;
        		}
        		f = U[t+l];
        		g = (f < 0) ? sqrt(s) : -sqrt(s);
                h = f * g - s;
                U[t+l] = f - g;
                for(k = l;k < N;++k) {
                	e[k] = U[t+k] / h;
                }

				for (j = l; j < M; j++) {
					s = 0.0;
					t2 = j * N;
					for (k = l; k < N; k++) {
						s += U[t2+k] * U[t+k];
					}
					for (k = l; k < N; k++) {
						U[t2+k] += s * e[k];
					}
				}
                for (k = l; k < N; k++)
                    U[t+k] *= scale;
        	}

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	//Accumulating Right Hand Transformations

		for(i = N - 1;i >= 0;--i) {
			t = i * N;
			if (i < N - 1) {
				if (g != 0.0) {
					h = U[t+i+1] * g;
					for(j = l;j < N;++j) {
						V[j*N+i] = U[t+j] / h;
					}
					for(j = l;j < N;++j) {
						s = 0.0;
						for(k = l; k < N;++k) {
							s += U[t+k] * V[k*N+j];
						}
						for(k = l; k < N;++k) {
							V[k*N+j] += (s * V[k*N+i]);
						}
					}
				}
				for(j = l; j < N;++j) {
					V[t+j] = V[j*N+i] = 0.0;
				}
			}
		    V[t+i] = 1.0;
			g = e[i];
			l = i;
		}



	//Accumulating Left Hand Transformations

		for(i = N - 1;i >= 0;--i) {
			t = i * N;
			l = i+1;
			g = q[i];

			if (i < N - 1) {
				for(j = l;j < N;++j) {
					U[t+j] = 0.0;
				}
			}

			if (g != 0.0) {
				if (i != N - 1) {
					//h = U[t+i] * g;
					for(j = l;j < N;++j) {
						s = 0.0;
						for(k = l; k < M;++k) {
							s += (U[k*N+i] * U[k*N+j]);
						}
						f = (s / U[t+i]) / g;
						for(k = i; k < M;++k) {
							U[k*N+j] += (f * U[k*N+i]);
						}
					}
				}
				for(j = i; j < M;++j) {
					U[j*N+i] = U[j*N+i] / g;
				}
			} else {
				for(j = i; j < M;++j) {
					U[j*N+i] = 0.0;
				}
			}

			U[t+i] += 1.0;
		}
	//	mdisplay(U,M,N);

		eps = eps * x;

		for(k = N - 1; k >= 0; --k) {
			iter = 0;

			while(1) {
				iter++;
				if (iter > SVDMAXITER) {
					printf("Convergence Not Achieved \n");
					return 15;
				}

				cancel = 1;
				for(l = k; l >= 0; --l) {
					if (fabs(e[l]) <= eps) {
						cancel = 0; //test f convergence
						break;
					}
					if (fabs(q[l-1]) <= eps) {
						//Cancel
						break;
					}
				}
				if (cancel) {
					c = 0.0;
					s = 1.0;
					l1 = l - 1;
					for(i = l; i <= k;++i) {
						f = s*e[i];
						e[i] *= c;
						if (fabs(f) <= eps) {
							break;
						}
						g = q[i];
						h = q[i] = hypot(f,g);
						c = g/h;
						s = -f/h;
						for(j = 0; j < M;++j) {
							t = j * N;
							y = U[t+l1];
							z = U[t+i];

							U[t+l1] = y * c + z * s;
							U[t+i] = z * c - y * s;
						}
					}
				}
				z = q[k];
				if (l != k) {
					x = q[l];
					y = q[k-1];
					g = e[k-1];
					h = e[k];
					f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
					g = hypot(f,1.0);
					if (f < 0.0) {
						temp = f - g;
					} else {
						temp = f+g;
					}
					f = x - (z / x) * z + (h / x) * (y / temp - h);

					//Next QR Transformation

					c = s = 1.0;
					for(i = l+1; i <= k;++i) {
						g = e[i];
						y = q[i];
						h = s * g;
						g = c * g;
						e[i-1] = z = hypot(f,h);
	                    c = f / z;
	                    s = h / z;
	                    f = x * c + g * s;
	                    g = g * c - x * s;
	                    h = y * s;
	                    y *= c;
	                    for(j = 0; j < N;++j) {
	                    	t = j * N;
	                        x = V[t+i-1];
	                        z = V[t+i];
	                        V[t+i-1] = x * c + z * s;
	                        V[t+i] = z * c - x * s;
	                    }
	                    q[i-1] = z = hypot(f,h);
	                    if (z != 0.0) {
	                        c = f / z;
	                        s = h / z;
	                    }
	                    f = c * g + s * y;
	                    x = c * y - s * g;
	                    for(j = 0; j < M;++j) {
	                    	t = j * N;
	                        y = U[t+i-1];
	                        z = U[t+i];
	                        U[t+i-1] = y * c + z * s;
	                        U[t+i] = z * c - y * s;
	                    }
					}
	                    e[l] = 0.0;
	                    e[k] = f;
	                    q[k] = x;

				} else {
					//convergence
	                if (z < 0.0) {
	                    q[k] = -z;
	                    for (j = 0; j < N; j++) {
	                    	t = j *N;
	                        V[t+k] = -V[t+k];
	                    }
	                }
	                break;
				}
			}
		}

		svd_sort(U,M,N,V,q);

		free(e);
		return ierr;
}